

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

void handle_conn_shutdown(EVmaster master,EVmaster_msg_ptr msg)

{
  int iVar1;
  __pid_t _Var2;
  pthread_t pVar3;
  long lVar4;
  long in_RSI;
  long *in_RDI;
  timespec ts_5;
  timespec ts_4;
  int j_1;
  int node;
  timespec ts_3;
  timespec ts_2;
  EVdfg_stone_state out_stone;
  int out_stone_id;
  int j;
  timespec ts_1;
  char *contact_str;
  char *failed_node;
  int target_stone;
  int i;
  timespec ts;
  EVdfg dfg;
  EVdfg_stone_state reporting_stone;
  int stone;
  int *in_stack_fffffffffffffee8;
  FILE *pFVar5;
  char *in_stack_fffffffffffffef0;
  EVmaster in_stack_ffffffffffffff00;
  FILE *in_stack_ffffffffffffff08;
  CManager in_stack_ffffffffffffff10;
  FILE *in_stack_ffffffffffffff28;
  CManager in_stack_ffffffffffffff30;
  timespec local_b8;
  timespec local_a8;
  int local_98;
  uint local_94;
  timespec local_90;
  timespec local_80;
  EVdfg_stone_state local_70;
  int local_68;
  uint local_64;
  timespec local_60;
  undefined8 local_50;
  undefined8 local_48;
  uint local_40;
  uint local_3c;
  timespec local_38;
  long local_28;
  EVdfg_stone_state local_20;
  int local_14;
  long *local_8;
  
  local_14 = *(int *)(in_RSI + 0x10);
  local_8 = in_RDI;
  local_20 = find_stone_state(local_14,*(EVdfg_configuration *)(in_RDI[5] + 0x30));
  local_28 = local_8[5];
  local_20->condition = EVstone_Frozen;
  *(undefined4 *)(local_8 + 6) = 3;
  iVar1 = CMtrace_val[0xd];
  if (*(long *)(*local_8 + 0x120) == 0) {
    iVar1 = CMtrace_init(in_stack_ffffffffffffff30,
                         (CMTraceType)((ulong)in_stack_ffffffffffffff28 >> 0x20));
  }
  if (iVar1 != 0) {
    if (CMtrace_PID != 0) {
      pFVar5 = *(FILE **)(*local_8 + 0x120);
      _Var2 = getpid();
      pVar3 = pthread_self();
      fprintf(pFVar5,"P%lxT%lx - ",(long)_Var2,pVar3);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_38);
      fprintf(*(FILE **)(*local_8 + 0x120),"%lld.%.9ld - ",local_38.tv_sec,local_38.tv_nsec);
    }
    fprintf(*(FILE **)(*local_8 + 0x120),
            "EVDFG conn_shutdown_handler -  master DFG state is now %s\n",
            str_state[*(uint *)(local_8 + 6)]);
  }
  fflush(*(FILE **)(*local_8 + 0x120));
  if (local_8[2] != 0) {
    local_40 = 0xffffffff;
    local_48 = 0;
    local_50 = 0;
    iVar1 = CMtrace_val[0xd];
    if (*(long *)(*local_8 + 0x120) == 0) {
      iVar1 = CMtrace_init(in_stack_ffffffffffffff30,
                           (CMTraceType)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    }
    if (iVar1 != 0) {
      if (CMtrace_PID != 0) {
        in_stack_ffffffffffffff28 = *(FILE **)(*local_8 + 0x120);
        _Var2 = getpid();
        in_stack_ffffffffffffff30 = (CManager)(long)_Var2;
        pVar3 = pthread_self();
        fprintf(in_stack_ffffffffffffff28,"P%lxT%lx - ",in_stack_ffffffffffffff30,pVar3);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_60);
        fprintf(*(FILE **)(*local_8 + 0x120),"%lld.%.9ld - ",local_60.tv_sec,local_60.tv_nsec);
      }
      fprintf(*(FILE **)(*local_8 + 0x120),"IN CONN_SHUTDOWN_HANDLER\n");
    }
    fflush(*(FILE **)(*local_8 + 0x120));
    for (local_3c = 0; (int)local_3c < *(int *)(local_28 + 0x10); local_3c = local_3c + 1) {
      for (local_64 = 0;
          (int)local_64 <
          *(int *)(*(long *)(*(long *)(*(long *)(local_28 + 0x30) + 8) + (long)(int)local_3c * 8) +
                  0x20); local_64 = local_64 + 1) {
        if (*(int *)(*(long *)(*(long *)(*(long *)(*(long *)(local_28 + 0x30) + 8) +
                                        (long)(int)local_3c * 8) + 0x28) + (long)(int)local_64 * 4)
            == local_14) {
          local_68 = *(int *)(*(long *)(*(long *)(*(long *)(*(long *)(local_28 + 0x30) + 8) +
                                                 (long)(int)local_3c * 8) + 0x28) +
                             (long)(int)local_64 * 4);
          local_70 = find_stone_state(local_68,*(EVdfg_configuration *)(local_28 + 0x30));
          iVar1 = CMtrace_val[0xd];
          if (*(long *)(*local_8 + 0x120) == 0) {
            iVar1 = CMtrace_init(in_stack_ffffffffffffff30,
                                 (CMTraceType)((ulong)in_stack_ffffffffffffff28 >> 0x20));
          }
          if (iVar1 != 0) {
            if (CMtrace_PID != 0) {
              pFVar5 = *(FILE **)(*local_8 + 0x120);
              _Var2 = getpid();
              pVar3 = pthread_self();
              fprintf(pFVar5,"P%lxT%lx - ",(long)_Var2,pVar3);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,&local_80);
              fprintf(*(FILE **)(*local_8 + 0x120),"%lld.%.9ld - ",local_80.tv_sec,local_80.tv_nsec)
              ;
            }
            fprintf(*(FILE **)(*local_8 + 0x120),"Found reporting stone as output %d of stone %d\n",
                    (ulong)local_64,(ulong)local_3c);
          }
          fflush(*(FILE **)(*local_8 + 0x120));
          parse_bridge_action_spec
                    (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,(char **)0x164fdf);
          iVar1 = CMtrace_val[0xd];
          if (*(long *)(*local_8 + 0x120) == 0) {
            iVar1 = CMtrace_init(in_stack_ffffffffffffff30,
                                 (CMTraceType)((ulong)in_stack_ffffffffffffff28 >> 0x20));
          }
          if (iVar1 != 0) {
            if (CMtrace_PID != 0) {
              in_stack_ffffffffffffff08 = *(FILE **)(*local_8 + 0x120);
              _Var2 = getpid();
              in_stack_ffffffffffffff10 = (CManager)(long)_Var2;
              pVar3 = pthread_self();
              fprintf(in_stack_ffffffffffffff08,"P%lxT%lx - ",in_stack_ffffffffffffff10,pVar3);
            }
            if (CMtrace_timing != 0) {
              clock_gettime(1,&local_90);
              fprintf(*(FILE **)(*local_8 + 0x120),"%lld.%.9ld - ",local_90.tv_sec,local_90.tv_nsec)
              ;
            }
            fprintf(*(FILE **)(*local_8 + 0x120),"Dead stone is %d\n",(ulong)local_40);
          }
          fflush(*(FILE **)(*local_8 + 0x120));
        }
      }
    }
    for (local_3c = 0; (int)local_3c < *(int *)(local_28 + 0x10); local_3c = local_3c + 1) {
      if (*(uint *)(*(long *)(*(long *)(*(long *)(local_28 + 0x30) + 8) + (long)(int)local_3c * 8) +
                   8) == local_40) {
        local_94 = **(uint **)(*(long *)(*(long *)(local_28 + 0x30) + 8) + (long)(int)local_3c * 8);
        iVar1 = CMtrace_val[0xd];
        if (*(long *)(*local_8 + 0x120) == 0) {
          iVar1 = CMtrace_init(in_stack_ffffffffffffff30,
                               (CMTraceType)((ulong)in_stack_ffffffffffffff28 >> 0x20));
        }
        if (iVar1 != 0) {
          if (CMtrace_PID != 0) {
            pFVar5 = *(FILE **)(*local_8 + 0x120);
            _Var2 = getpid();
            in_stack_ffffffffffffff00 = (EVmaster)(long)_Var2;
            pVar3 = pthread_self();
            fprintf(pFVar5,"P%lxT%lx - ",in_stack_ffffffffffffff00,pVar3);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_a8);
            fprintf(*(FILE **)(*local_8 + 0x120),"%lld.%.9ld - ",local_a8.tv_sec,local_a8.tv_nsec);
          }
          fprintf(*(FILE **)(*local_8 + 0x120),"Dead node is %d, name %s\n",(ulong)local_94,
                  *(undefined8 *)(local_8[7] + (long)(int)local_94 * 0x38 + 8));
        }
        fflush(*(FILE **)(*local_8 + 0x120));
        local_48 = *(undefined8 *)(local_8[7] + (long)(int)local_94 * 0x38 + 8);
        *(undefined4 *)(local_8[7] + (long)(int)local_94 * 0x38 + 0x2c) = 0xfffffffd;
        for (local_98 = 0; local_98 < *(int *)(local_28 + 0x10); local_98 = local_98 + 1) {
          if (**(uint **)(*(long *)(*(long *)(local_28 + 0x30) + 8) + (long)local_98 * 8) ==
              local_94) {
            iVar1 = CMtrace_val[0xd];
            if (*(long *)(*local_8 + 0x120) == 0) {
              iVar1 = CMtrace_init(in_stack_ffffffffffffff30,
                                   (CMTraceType)((ulong)in_stack_ffffffffffffff28 >> 0x20));
            }
            if (iVar1 != 0) {
              if (CMtrace_PID != 0) {
                pFVar5 = *(FILE **)(*local_8 + 0x120);
                _Var2 = getpid();
                lVar4 = (long)_Var2;
                pVar3 = pthread_self();
                fprintf(pFVar5,"P%lxT%lx - ",lVar4,pVar3);
              }
              if (CMtrace_timing != 0) {
                clock_gettime(1,&local_b8);
                fprintf(*(FILE **)(*local_8 + 0x120),"%lld.%.9ld - ",local_b8.tv_sec,
                        local_b8.tv_nsec);
              }
              fprintf(*(FILE **)(*local_8 + 0x120),"Dead node is %d, name %s\n",(ulong)local_94,
                      *(undefined8 *)(local_8[7] + (long)(int)local_94 * 0x38 + 8));
            }
            fflush(*(FILE **)(*local_8 + 0x120));
            *(undefined4 *)
             (*(long *)(*(long *)(*(long *)(local_28 + 0x30) + 8) + (long)local_98 * 8) + 0x5c) = 3;
          }
        }
      }
    }
    IntCManager_unlock(in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08,
                       (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
    (*(code *)local_8[2])(local_28,local_48,local_40);
    IntCManager_lock(in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08,
                     (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
    *(undefined4 *)(local_8 + 10) = 1;
    *(undefined4 *)(local_8 + 0xb) = 1;
    check_all_nodes_registered(in_stack_ffffffffffffff00);
  }
  return;
}

Assistant:

static void 
handle_conn_shutdown(EVmaster master, EVmaster_msg_ptr msg)
{
    int stone = msg->u.conn_shutdown.stone;
    EVdfg_stone_state reporting_stone = find_stone_state(stone, master->dfg->deployed_state);
    EVdfg dfg = master->dfg;

    /* this stone is automatically frozen by EVPath */
    reporting_stone->condition = EVstone_Frozen;
    master->state = DFG_Reconfiguring;
    
    CMtrace_out(master->cm, EVdfgVerbose, "EVDFG conn_shutdown_handler -  master DFG state is now %s\n", str_state[master->state]);
    if (master->node_fail_handler != NULL) {
	int i;
	int target_stone = -1;
	char *failed_node = NULL;
	char *contact_str = NULL;
	CMtrace_out(master->cm, EVdfgVerbose, "IN CONN_SHUTDOWN_HANDLER\n");
	for (i=0; i< dfg->stone_count; i++) {
	    int j;
	    for (j = 0; j < dfg->deployed_state->stones[i]->out_count; j++) {
		if (dfg->deployed_state->stones[i]->out_links[j] == stone) {
		    int out_stone_id = dfg->deployed_state->stones[i]->out_links[j];
		    EVdfg_stone_state out_stone = find_stone_state(out_stone_id, dfg->deployed_state);
		    CMtrace_out(master->cm, EVdfgVerbose, "Found reporting stone as output %d of stone %d\n",
				j, i);
		    parse_bridge_action_spec(out_stone->action, 
					     &target_stone, &contact_str);
		    CMtrace_out(master->cm, EVdfgVerbose, "Dead stone is %d\n", target_stone);
		}
	    }
	}
	for (i=0; i< dfg->stone_count; i++) {
	    if (dfg->deployed_state->stones[i]->stone_id == target_stone) {
		int node = dfg->deployed_state->stones[i]->node;
		int j;
		CMtrace_out(master->cm, EVdfgVerbose, "Dead node is %d, name %s\n", node,
			    master->nodes[node].canonical_name);
		failed_node = master->nodes[node].canonical_name;
		master->nodes[node].shutdown_status_contribution = STATUS_FAILED;
		for (j=0; j< dfg->stone_count; j++) {
		    if (dfg->deployed_state->stones[j]->node == node) {;
			CMtrace_out(master->cm, EVdfgVerbose, "Dead node is %d, name %s\n", node,
				    master->nodes[node].canonical_name);
			dfg->deployed_state->stones[j]->condition = EVstone_Lost;
		    }
		}
	    }
	}
	CManager_unlock(master->cm);
	master->node_fail_handler(dfg, failed_node, target_stone);
	CManager_lock(master->cm);
	master->reconfig = 1;
	master->sig_reconfig_bool = 1;
	check_all_nodes_registered(master);
    }
}